

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<unsigned_long_long> __thiscall
kj::anon_unknown_55::tryParseUnsigned(anon_unknown_55 *this,StringPtr *s,unsigned_long_long max)

{
  bool bVar1;
  char cVar2;
  int *piVar3;
  char *pcVar4;
  char *s_00;
  int __base;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 aVar5;
  Maybe<unsigned_long_long> MVar6;
  ulonglong local_38;
  unsigned_long_long value;
  char *endPtr;
  unsigned_long_long local_20;
  unsigned_long_long max_local;
  StringPtr *s_local;
  
  local_20 = max;
  max_local = (unsigned_long_long)s;
  s_local = (StringPtr *)this;
  bVar1 = StringPtr::operator==(s,(void *)0x0);
  if (bVar1) {
    Maybe<unsigned_long_long>::Maybe((Maybe<unsigned_long_long> *)this);
    aVar5 = extraout_RDX;
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    pcVar4 = StringPtr::begin((StringPtr *)max_local);
    s_00 = StringPtr::cStr((StringPtr *)max_local);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    local_38 = strtoull(pcVar4,(char **)&value,__base);
    pcVar4 = StringPtr::end((StringPtr *)max_local);
    if ((char *)value == pcVar4) {
      piVar3 = __errno_location();
      if ((*piVar3 != 0x22) && (local_38 <= local_20)) {
        cVar2 = StringPtr::operator[]((StringPtr *)max_local,0);
        if (cVar2 != '-') {
          Maybe<unsigned_long_long>::Maybe((Maybe<unsigned_long_long> *)this,&local_38);
          aVar5 = extraout_RDX_01;
          goto LAB_0085dd0a;
        }
      }
    }
    Maybe<unsigned_long_long>::Maybe((Maybe<unsigned_long_long> *)this);
    aVar5 = extraout_RDX_00;
  }
LAB_0085dd0a:
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long_long>)MVar6.ptr;
}

Assistant:

Maybe<unsigned long long> tryParseUnsigned(const StringPtr& s, unsigned long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || max < value || s[0] == '-') { return kj::none; }
  return value;
}